

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O2

int av1_palette_color_cost_y(PALETTE_MODE_INFO *pmi,uint16_t *color_cache,int n_cache,int bit_depth)

{
  int iVar1;
  uint8_t cache_color_found [16];
  int out_cache_colors [8];
  
  iVar1 = av1_index_color_cache
                    (color_cache,n_cache,pmi->palette_colors,(uint)pmi->palette_size[0],
                     cache_color_found,out_cache_colors);
  iVar1 = delta_encode_cost(out_cache_colors,iVar1,bit_depth,1);
  return (iVar1 + n_cache) * 0x200;
}

Assistant:

int av1_palette_color_cost_y(const PALETTE_MODE_INFO *const pmi,
                             const uint16_t *color_cache, int n_cache,
                             int bit_depth) {
  const int n = pmi->palette_size[0];
  int out_cache_colors[PALETTE_MAX_SIZE];
  uint8_t cache_color_found[2 * PALETTE_MAX_SIZE];
  const int n_out_cache =
      av1_index_color_cache(color_cache, n_cache, pmi->palette_colors, n,
                            cache_color_found, out_cache_colors);
  const int total_bits =
      n_cache + delta_encode_cost(out_cache_colors, n_out_cache, bit_depth, 1);
  return av1_cost_literal(total_bits);
}